

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O2

void __thiscall yaml::Value::Value(Value *this,Value *param_1)

{
  pointer pVVar1;
  
  this->type_ = param_1->type_;
  std::__cxx11::string::string((string *)&this->string_,(string *)&param_1->string_);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->mapping_).map_._M_t._M_impl.super__Rb_tree_header,
             &(param_1->mapping_).map_._M_t._M_impl.super__Rb_tree_header);
  pVVar1 = (param_1->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar1;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ExpectedRef<const Mapping, std::string> getMapping() const {
		if (type_ != Type::Mapping)
			return Unexpected<std::string>("Value is not of Mapping type");
		return std::cref(mapping_);
	}